

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

entityfilter_ctx * ctemplate_htmlparser::entityfilter_new(void)

{
  entityfilter_ctx *peVar1;
  
  peVar1 = (entityfilter_ctx *)malloc(0x1c);
  if (peVar1 != (entityfilter_ctx *)0x0) {
    peVar1->buffer[0] = '\0';
    peVar1->buffer_pos = 0;
    peVar1->in_entity = 0;
  }
  return peVar1;
}

Assistant:

entityfilter_ctx *entityfilter_new()
{
    entityfilter_ctx *ctx;
    ctx = CAST(entityfilter_ctx *,
               malloc(sizeof(entityfilter_ctx)));

    if (ctx == NULL)
      return NULL;
    ctx->buffer[0] = 0;
    ctx->buffer_pos = 0;
    ctx->in_entity = 0;

    return ctx;
}